

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O3

void __thiscall
protozero::
iterator_range<protozero::const_varint_iterator<int>,_std::pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>_>
::drop_front(iterator_range<protozero::const_varint_iterator<int>,_std::pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>_>
             *this)

{
  undefined4 in_EAX;
  int iVar1;
  assert_error *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(*(int *)&(this->
                                  super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                                  ).second.m_data ==
                        *(int *)&(this->
                                 super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                                 ).first.m_data);
  auVar3._4_4_ = -(uint)(*(int *)((long)&(this->
                                         super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                                         ).second.m_data + 4) ==
                        *(int *)((long)&(this->
                                        super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                                        ).first.m_data + 4));
  auVar3._8_4_ = -(uint)(*(int *)&(this->
                                  super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                                  ).second.m_end ==
                        *(int *)&(this->
                                 super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                                 ).first.m_end);
  auVar3._12_4_ =
       -(uint)(*(int *)((long)&(this->
                               super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                               ).second.m_end + 4) ==
              *(int *)((long)&(this->
                              super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>
                              ).first.m_end + 4));
  auVar2._4_4_ = auVar3._0_4_;
  auVar2._0_4_ = auVar3._4_4_;
  auVar2._8_4_ = auVar3._12_4_;
  auVar2._12_4_ = auVar3._8_4_;
  iVar1 = movmskpd(in_EAX,auVar2 & auVar3);
  if (iVar1 != 3) {
    const_varint_iterator<int>::operator++((const_varint_iterator<int> *)this);
    return;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"!empty()");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr iterator begin() const noexcept {
        return this->first;
    }